

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.hpp
# Opt level: O0

void __thiscall
viennamath::rt_expr<viennamath::rt_expression_interface<double>>::
rt_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>,viennamath::op_plus<double>,viennamath::ct_variable<1ul>>
          (rt_expr<viennamath::rt_expression_interface<double>> *this,
          ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>
          *other)

{
  rt_binary_expr<viennamath::rt_expression_interface<double>> *this_00;
  auto_ptr<viennamath::rt_expression_interface<double>_> local_28;
  rt_expression_interface<double> *local_20;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>
  *local_18;
  ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>
  *other_local;
  rt_expr<viennamath::rt_expression_interface<double>_> *this_local;
  
  local_18 = other;
  other_local = (ct_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0UL>,_viennamath::op_mult<double>,_viennamath::ct_variable<0UL>_>,_viennamath::op_plus<double>,_viennamath::ct_variable<1UL>_>
                 *)this;
  std::auto_ptr<const_viennamath::rt_expression_interface<double>_>::auto_ptr
            ((auto_ptr<const_viennamath::rt_expression_interface<double>_> *)this,
             (element_type *)0x0);
  this_00 = (rt_binary_expr<viennamath::rt_expression_interface<double>> *)operator_new(0x20);
  rt_binary_expr<viennamath::rt_expression_interface<double>>::
  rt_binary_expr<viennamath::ct_binary_expr<viennamath::ct_variable<0ul>,viennamath::op_mult<double>,viennamath::ct_variable<0ul>>,viennamath::op_plus<double>,1ul>
            (this_00,local_18);
  std::auto_ptr<viennamath::rt_expression_interface<double>_>::auto_ptr
            (&local_28,(element_type *)this_00);
  local_20 = (rt_expression_interface<double> *)
             std::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_28);
  std::auto_ptr<const_viennamath::rt_expression_interface<double>_>::operator=
            ((auto_ptr<const_viennamath::rt_expression_interface<double>_> *)this,
             (auto_ptr_ref<const_viennamath::rt_expression_interface<double>_>)local_20);
  std::auto_ptr<viennamath::rt_expression_interface<double>_>::~auto_ptr(&local_28);
  return;
}

Assistant:

rt_expr(ct_binary_expr<LHS, OP, RHS> const & other)
      {
        rt_expr_ = std::auto_ptr<InterfaceType>(new rt_binary_expr<InterfaceType>(other));
      }